

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

bool __thiscall Clasp::ClaspConfig::Impl::addPost(Impl *this,Solver *s,SolverParams *opts)

{
  DefaultUnfoundedCheck *pDVar1;
  ulong uVar2;
  AcyclicityCheck *this_00;
  pointer pCVar3;
  pointer this_01;
  bool bVar4;
  unique_lock<std::mutex> lock;
  
  if (s->shared_ == (SharedContext *)0x0) {
    Potassco::fail(-1,"bool Clasp::ClaspConfig::Impl::addPost(Solver &, const SolverParams &)",0x6d,
                   "s.sharedContext() != 0","Solver not attached!",0);
  }
  if ((s->shared_->sccGraph).ptr_ < 2) {
LAB_00116cb9:
    if (1 < (s->shared_->extGraph).ptr_) {
      std::unique_lock<std::mutex>::unique_lock(&lock,&this->mutex);
      bVar4 = false;
      while (lock._M_owns != false) {
        uVar2 = 1L << (SUB81(s->strategy_,7) >> 2);
        bVar4 = (uVar2 & this->acycSet) == 0;
        if (bVar4) {
          this->acycSet = uVar2 | this->acycSet;
        }
        std::unique_lock<std::mutex>::unlock(&lock);
      }
      std::unique_lock<std::mutex>::~unique_lock(&lock);
      if (bVar4) {
        this_00 = (AcyclicityCheck *)operator_new(0x90);
        AcyclicityCheck::AcyclicityCheck
                  (this_00,(DependencyGraph *)((s->shared_->extGraph).ptr_ & 0xfffffffffffffffe));
        bVar4 = Solver::addPost(s,(PostPropagator *)this_00);
        if (!bVar4) goto LAB_00116db7;
      }
    }
    this_01 = (this->pp).ebo_.buf;
    pCVar3 = this_01 + (this->pp).ebo_.size;
    for (; this_01 != pCVar3; this_01 = this_01 + 1) {
      std::unique_lock<std::mutex>::unique_lock(&lock,&this->mutex);
      while (lock._M_owns == true) {
        bVar4 = ConfiguratorProxy::applyConfig(this_01,s);
        if (!bVar4) {
          std::unique_lock<std::mutex>::~unique_lock(&lock);
          return this_01 == pCVar3;
        }
        std::unique_lock<std::mutex>::unlock(&lock);
      }
      std::unique_lock<std::mutex>::~unique_lock(&lock);
    }
    bVar4 = true;
  }
  else {
    pDVar1 = (DefaultUnfoundedCheck *)Solver::getPost(s,10);
    if (pDVar1 != (DefaultUnfoundedCheck *)0x0) {
      DefaultUnfoundedCheck::setReasonStrategy
                (pDVar1,*(uint *)&opts->field_0x18 >> 0x12 & shared_reason);
      goto LAB_00116cb9;
    }
    pDVar1 = (DefaultUnfoundedCheck *)operator_new(0xf8);
    DefaultUnfoundedCheck::DefaultUnfoundedCheck
              (pDVar1,(DependencyGraph *)((s->shared_->sccGraph).ptr_ & 0xfffffffffffffffe),
               *(uint *)&opts->field_0x18 >> 0x12 & shared_reason);
    bVar4 = Solver::addPost(s,(PostPropagator *)pDVar1);
    if (bVar4) goto LAB_00116cb9;
LAB_00116db7:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

void ClaspConfig::Impl::prepare(SharedContext& ctx) {
	if (ctx.concurrency() < 64) {
		acycSet &= (bit_mask<uint64>(ctx.concurrency()) - 1);
	}
	for (PPVec::iterator it = pp.begin(), end = pp.end(); it != end; ++it) {
		it->prepare(ctx);
	}
}